

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *p_j2k,opj_image_t *p_image)

{
  uint uVar1;
  opj_image_comp_t *poVar2;
  opj_image_comp_t *poVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  OPJ_UINT32 OVar10;
  OPJ_UINT32 OVar11;
  opj_image_comp_t *poVar12;
  OPJ_INT32 **ppOVar13;
  OPJ_BOOL OVar14;
  long lVar15;
  ulong uVar16;
  
  uVar16 = (ulong)(p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
  if (uVar16 == 0) {
    lVar15 = 0;
    OVar14 = 1;
    for (uVar16 = 0; uVar16 < p_image->numcomps; uVar16 = uVar16 + 1) {
      poVar12 = p_image->comps;
      *(undefined4 *)((long)&poVar12->resno_decoded + lVar15) =
           *(undefined4 *)((long)&p_j2k->m_output_image->comps->resno_decoded + lVar15);
      opj_image_data_free(*(void **)((long)&poVar12->data + lVar15));
      poVar12 = p_j2k->m_output_image->comps;
      *(undefined8 *)((long)&p_image->comps->data + lVar15) =
           *(undefined8 *)((long)&poVar12->data + lVar15);
      *(undefined8 *)((long)&poVar12->data + lVar15) = 0;
      lVar15 = lVar15 + 0x40;
    }
  }
  else {
    poVar12 = (opj_image_comp_t *)opj_malloc(uVar16 << 6);
    if (poVar12 == (opj_image_comp_t *)0x0) {
      opj_image_destroy(p_j2k->m_private_image);
      p_j2k->m_private_image = (opj_image_t *)0x0;
      OVar14 = 0;
    }
    else {
      lVar15 = 0x30;
      for (uVar16 = 0; uVar16 < p_image->numcomps; uVar16 = uVar16 + 1) {
        opj_image_data_free(*(void **)((long)&p_image->comps->dx + lVar15));
        *(undefined8 *)((long)&p_image->comps->dx + lVar15) = 0;
        lVar15 = lVar15 + 0x40;
      }
      ppOVar13 = &poVar12->data;
      for (uVar16 = 0; uVar16 < (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
          uVar16 = uVar16 + 1) {
        uVar1 = (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode[uVar16];
        poVar2 = p_j2k->m_output_image->comps;
        poVar3 = poVar2 + uVar1;
        OVar10 = poVar3->dx;
        OVar11 = poVar3->dy;
        uVar4 = *(undefined8 *)&poVar3->w;
        uVar5 = *(undefined8 *)&poVar2[uVar1].x0;
        uVar6 = *(undefined8 *)(&poVar2[uVar1].x0 + 2);
        uVar7 = *(undefined8 *)&poVar2[uVar1].sgnd;
        uVar8 = *(undefined8 *)(&poVar2[uVar1].sgnd + 2);
        uVar9 = (&poVar2[uVar1].data)[1];
        *ppOVar13 = poVar2[uVar1].data;
        ppOVar13[1] = (OPJ_INT32 *)uVar9;
        ppOVar13[-2] = (OPJ_INT32 *)uVar7;
        ppOVar13[-1] = (OPJ_INT32 *)uVar8;
        ppOVar13[-4] = (OPJ_INT32 *)uVar5;
        ppOVar13[-3] = (OPJ_INT32 *)uVar6;
        ((opj_image_comp_t *)(ppOVar13 + -6))->dx = OVar10;
        ((opj_image_comp_t *)(ppOVar13 + -6))->dy = OVar11;
        ppOVar13[-5] = (OPJ_INT32 *)uVar4;
        poVar3 = p_j2k->m_output_image->comps;
        *(OPJ_UINT32 *)((long)ppOVar13 + -0xc) = poVar3[uVar1].resno_decoded;
        *ppOVar13 = poVar3[uVar1].data;
        poVar3[uVar1].data = (OPJ_INT32 *)0x0;
        ppOVar13 = ppOVar13 + 8;
      }
      lVar15 = 0x30;
      for (uVar16 = 0; uVar16 < p_image->numcomps; uVar16 = uVar16 + 1) {
        if (*(long *)((long)&p_j2k->m_output_image->comps->dx + lVar15) != 0) {
          __assert_fail("p_j2k->m_output_image->comps[compno].data == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                        ,0x2eb9,
                        "OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *, opj_image_t *)"
                       );
        }
        opj_image_data_free((void *)0x0);
        *(undefined8 *)((long)&p_j2k->m_output_image->comps->dx + lVar15) = 0;
        lVar15 = lVar15 + 0x40;
      }
      p_image->numcomps = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
      opj_free(p_image->comps);
      p_image->comps = poVar12;
      OVar14 = 1;
    }
  }
  return OVar14;
}

Assistant:

static OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t * p_j2k,
        opj_image_t * p_image)
{
    OPJ_UINT32 compno;

    /* Move data and copy one information from codec to output image*/
    if (p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode > 0) {
        opj_image_comp_t* newcomps =
            (opj_image_comp_t*) opj_malloc(
                p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode *
                sizeof(opj_image_comp_t));
        if (newcomps == NULL) {
            opj_image_destroy(p_j2k->m_private_image);
            p_j2k->m_private_image = NULL;
            return OPJ_FALSE;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = NULL;
        }
        for (compno = 0;
                compno < p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode; compno++) {
            OPJ_UINT32 src_compno =
                p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode[compno];
            memcpy(&(newcomps[compno]),
                   &(p_j2k->m_output_image->comps[src_compno]),
                   sizeof(opj_image_comp_t));
            newcomps[compno].resno_decoded =
                p_j2k->m_output_image->comps[src_compno].resno_decoded;
            newcomps[compno].data = p_j2k->m_output_image->comps[src_compno].data;
            p_j2k->m_output_image->comps[src_compno].data = NULL;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            assert(p_j2k->m_output_image->comps[compno].data == NULL);
            opj_image_data_free(p_j2k->m_output_image->comps[compno].data);
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
        p_image->numcomps = p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode;
        opj_free(p_image->comps);
        p_image->comps = newcomps;
    } else {
        for (compno = 0; compno < p_image->numcomps; compno++) {
            p_image->comps[compno].resno_decoded =
                p_j2k->m_output_image->comps[compno].resno_decoded;
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;
#if 0
            char fn[256];
            sprintf(fn, "/tmp/%d.raw", compno);
            FILE *debug = fopen(fn, "wb");
            fwrite(p_image->comps[compno].data, sizeof(OPJ_INT32),
                   p_image->comps[compno].w * p_image->comps[compno].h, debug);
            fclose(debug);
#endif
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
    }
    return OPJ_TRUE;
}